

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcTriangleFans.cpp
# Opt level: O1

O3DGCErrorCode o3dgc::SaveBinData(Vector<long> *data,BinaryStream *bstream)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  uchar local_3a;
  byte local_39;
  unsigned_long local_38;
  
  local_38 = (bstream->m_stream).m_size;
  lVar5 = 5;
  do {
    local_3a = '\0';
    Vector<unsigned_char>::PushBack(&bstream->m_stream,&local_3a);
    lVar5 = lVar5 + -1;
  } while (lVar5 != 0);
  uVar3 = data->m_size;
  lVar5 = 5;
  uVar6 = uVar3;
  do {
    local_39 = (byte)uVar6 & 0x7f;
    Vector<unsigned_char>::PushBack(&bstream->m_stream,&local_39);
    uVar6 = uVar6 >> 7;
    lVar5 = lVar5 + -1;
  } while (lVar5 != 0);
  if (uVar3 != 0) {
    uVar6 = 0;
    do {
      lVar5 = 0;
      uVar4 = 0;
      do {
        lVar5 = (data->m_buffer[uVar6 + uVar4] << ((byte)uVar4 & 0x3f)) + lVar5;
        uVar1 = uVar4 + 1;
        if (5 < uVar4) break;
        lVar2 = uVar4 + uVar6;
        uVar4 = uVar1;
      } while (lVar2 + 1U < uVar3);
      BinaryStream::WriteUCharASCII(bstream,(uchar)lVar5);
      uVar6 = uVar6 + uVar1;
    } while (uVar6 < uVar3);
  }
  BinaryStream::WriteUInt32ASCII(bstream,local_38,(bstream->m_stream).m_size - local_38);
  return O3DGC_OK;
}

Assistant:

O3DGCErrorCode    SaveBinData(const Vector<long> & data,
                                  BinaryStream & bstream) 
    {
        unsigned long start = bstream.GetSize();
        bstream.WriteUInt32ASCII(0);
        const unsigned long size = data.GetSize();
        long symbol;
        bstream.WriteUInt32ASCII(size);
        for(unsigned long i = 0; i < size; )
        {
            symbol = 0;
            for(unsigned long h = 0; h < O3DGC_BINARY_STREAM_BITS_PER_SYMBOL0 && i < size; ++h)
            {
                symbol += (data[i] << h);
                ++i;
            }
            bstream.WriteUCharASCII((unsigned char) symbol);
        }
        bstream.WriteUInt32ASCII(start, bstream.GetSize() - start);
        return O3DGC_OK;
    }